

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O0

void cold_boot_init(cpu_registers *registers)

{
  uint16_t PC;
  uint16_t initial_PC;
  uint8_t initial_flags;
  uint8_t initial_S;
  uint8_t initial_Y;
  uint8_t initial_X;
  uint8_t initial_A;
  cpu_registers *registers_local;
  
  PC = fetch_reset_vector();
  init_cpu_registers(registers,'\0','\0','\0',PC,0xfd,'$');
  return;
}

Assistant:

void cold_boot_init(cpu_registers* registers) {
    const uint8_t initial_A = 0;
    const uint8_t initial_X = 0;
    const uint8_t initial_Y = 0;
    const uint8_t initial_S = 0xFD;
    const uint8_t initial_flags = 0x24;

    //To run NESTEST
    //uint16_t initial_PC = 0xC000;
    uint16_t initial_PC = fetch_reset_vector();
    init_cpu_registers(registers, initial_A, initial_X, initial_Y, initial_PC,
                       initial_S, initial_flags);
}